

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s.hpp
# Opt level: O2

iterator __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::do_find_bisect(sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                 *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  pointer pvVar1;
  bool bVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  value_type elem;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_98.first._M_dataplus._M_p = (pointer)&local_98.first.field_2;
  local_98.first._M_string_length = 0;
  local_98.first.field_2._M_local_buf[0] = '\0';
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_58,key,&local_98.first);
  std::__cxx11::string::~string((string *)&local_98);
  pvVar1 = (this->data_vec_).data_ptr_;
  ppVar3 = pvVar1 + (this->data_vec_).size_;
  __p = std::
        __lower_bound<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::pair<std::__cxx11::string_const,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_val<estl::sort_map_s<std::__cxx11::string,std::__cxx11::string,30ul,std::less<std::__cxx11::string>,10ul>::comperator>>
                  (pvVar1,ppVar3,&local_58);
  if (__p != ppVar3) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_98,__p);
    bVar2 = std::operator<(&local_58.first,&local_98.first);
    if (!bVar2) {
      ppVar3 = __p;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_98);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_58);
  return ppVar3;
}

Assistant:

iterator do_find_bisect (const Key& key)
    {
        //std::cerr << "do_find_bisect(" << key << ")\n";
        const value_type elem (key,T());

        const iterator it_end = end();
        const iterator it = std::lower_bound(data_vec_.begin(), it_end, elem, comperator_);
        return !(it == it_end) && !comperator_(elem, *it) ? it : it_end;
    }